

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O0

cio_error cio_random_seed_rng(cio_rng_t *rng)

{
  cio_error cVar1;
  uint64_t uStack_28;
  cio_error err;
  uint64_t seeds [2];
  cio_rng_t *rng_local;
  
  cVar1 = cio_entropy_get_bytes(&stack0xffffffffffffffd8,0x10);
  if (cVar1 == CIO_SUCCESS) {
    pcg_setseq_64_srandom_r(rng,uStack_28,seeds[0]);
  }
  else {
    pcg_setseq_64_srandom_r(rng,0,0);
  }
  return cVar1;
}

Assistant:

enum cio_error cio_random_seed_rng(cio_rng_t *rng)
{
	uint64_t seeds[2];
	enum cio_error err = cio_entropy_get_bytes(&seeds, sizeof(seeds));
	if (cio_likely(err == CIO_SUCCESS)) {
		pcg_setseq_64_srandom_r(rng, seeds[0], seeds[1]);
	} else {
		pcg_setseq_64_srandom_r(rng, UINT64_C(0), UINT64_C(0));
	}

	return err;
}